

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Keno::generate20Numbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Keno *this)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  size_type sVar4;
  reference __x;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar5;
  undefined1 local_c8 [8];
  Keno_HotAndCold info;
  _Node_iterator_base<int,_false> local_a8;
  iterator it;
  int local_6c;
  int i;
  int maxNumbers;
  int first;
  int last;
  int currNumber;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> rand20NumsSet;
  Keno *this_local;
  vector<int,_std::allocator<int>_> *rand20Nums;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  rand20NumsSet._M_h._M_single_bucket._7_1_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)&last);
  for (local_6c = 0; local_6c < 0x14; local_6c = local_6c + 1) {
    iVar2 = rand();
    first = iVar2 % 0x50 + 1;
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)&last
               ,&first);
  }
  sVar4 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
                    ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )&last);
  if (sVar4 < 0x14) {
    while (sVar4 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   ::size((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)&last), sVar4 < 0x14) {
      iVar2 = rand();
      first = iVar2 % 0x50 + 1;
      pVar5 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
              insert((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )&last,&first);
      it.super__Node_iterator_base<int,_false>._M_cur =
           (_Node_iterator_base<int,_false>)pVar5.first.super__Node_iterator_base<int,_false>._M_cur
      ;
    }
  }
  local_a8._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                 ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  &last);
  while( true ) {
    info._vectorTo80Nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  ::end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)&last);
    bVar1 = std::__detail::operator!=
                      (&local_a8,
                       (_Node_iterator_base<int,_false> *)
                       &info._vectorTo80Nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = std::__detail::_Node_iterator<int,_true,_false>::operator*
                    ((_Node_iterator<int,_true,_false> *)&local_a8);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,__x);
    std::__detail::_Node_iterator<int,_true,_false>::operator++
              ((_Node_iterator<int,_true,_false> *)&local_a8);
  }
  Keno_HotAndCold::Keno_HotAndCold((Keno_HotAndCold *)local_c8);
  Keno_HotAndCold::infoHotAndCold((Keno_HotAndCold *)local_c8,__return_storage_ptr__);
  rand20NumsSet._M_h._M_single_bucket._7_1_ = 1;
  Keno_HotAndCold::~Keno_HotAndCold((Keno_HotAndCold *)local_c8);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)&last);
  if ((rand20NumsSet._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Keno::generate20Numbers() {
	srand(time(0));
	std::vector<int> rand20Nums;
	std::unordered_set<int> rand20NumsSet;
	int currNumber;
	int last = 80;
	int first = 1;
	int const maxNumbers =20;
	//int currNumberSet;
	for (int i = 0; i < maxNumbers; ++i) {
		currNumber = rand() % (last + 1 - first) + first;
		rand20NumsSet.insert(currNumber);
	}
	if (rand20NumsSet.size() < maxNumbers) {
		while (rand20NumsSet.size() < maxNumbers) {
			currNumber = rand() % (last + 1 - first) + first;
			rand20NumsSet.insert(currNumber);
		}
	}
	
		for (auto it = rand20NumsSet.begin(); it != rand20NumsSet.end(); ++it) {
			rand20Nums.push_back(*it);
		}
	
	Keno_HotAndCold info;
	info.infoHotAndCold(rand20Nums);
	return rand20Nums;
}